

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttkern.c
# Opt level: O2

FT_Error tt_face_load_kern(TT_Face face,FT_Stream stream)

{
  ushort uVar1;
  FT_Error FVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  FT_Byte *pFVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  FT_Byte *pFVar13;
  FT_Byte *pFVar14;
  FT_ULong table_size;
  
  FVar2 = (*face->goto_table)(face,0x6b65726e,stream,&table_size);
  if (((FVar2 == 0) && (FVar2 = 0x8e, 3 < table_size)) &&
     (FVar2 = FT_Stream_ExtractFrame(stream,table_size,&face->kern_table), FVar2 == 0)) {
    face->kern_table_size = table_size;
    pFVar13 = face->kern_table;
    pFVar8 = pFVar13 + table_size;
    uVar4 = (uint)(ushort)(*(ushort *)(pFVar13 + 2) << 8 | *(ushort *)(pFVar13 + 2) >> 8);
    uVar9 = 0x20;
    if (uVar4 < 0x20) {
      uVar9 = uVar4;
    }
    uVar4 = 0;
    uVar10 = 0;
    uVar5 = 0;
    pFVar13 = pFVar13 + 4;
    while (((uVar3 = uVar9, uVar5 != uVar9 &&
            (uVar6 = 1 << ((byte)uVar5 & 0x1f), uVar3 = uVar5, pFVar13 + 6 <= pFVar8)) &&
           (uVar1 = *(ushort *)(pFVar13 + 2) << 8 | *(ushort *)(pFVar13 + 2) >> 8, 0xe < uVar1))) {
      pFVar14 = pFVar13 + uVar1;
      if (pFVar8 < pFVar13 + uVar1) {
        pFVar14 = pFVar8;
      }
      if (((pFVar13[4] == '\0') && ((pFVar13[5] & 3) == 1)) && (pFVar13 + 0xe <= pFVar14)) {
        lVar7 = (long)pFVar14 - (long)(pFVar13 + 0xe);
        uVar11 = (uint)(ushort)(*(ushort *)(pFVar13 + 6) << 8 | *(ushort *)(pFVar13 + 6) >> 8);
        uVar3 = (uint)(lVar7 / 6);
        if ((long)(ulong)(uVar11 * 6) <= lVar7) {
          uVar3 = uVar11;
        }
        uVar10 = uVar10 | uVar6;
        if (uVar3 != 0) {
          uVar11 = *(uint *)(pFVar13 + 0xe);
          uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                   uVar11 << 0x18;
          for (lVar7 = 0; (ulong)(uVar3 - 1) * 6 - lVar7 != 0; lVar7 = lVar7 + 6) {
            uVar12 = *(uint *)(pFVar13 + lVar7 + 0x14);
            uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                     uVar12 << 0x18;
            if (uVar12 < uVar11) goto LAB_0020672a;
            uVar11 = uVar12;
          }
          uVar4 = uVar4 | uVar6;
        }
      }
LAB_0020672a:
      uVar5 = uVar5 + 1;
      pFVar13 = pFVar14;
    }
    face->num_kern_tables = uVar3;
    face->kern_avail_bits = uVar10;
    face->kern_order_bits = uVar4;
    FVar2 = 0;
  }
  return FVar2;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_kern( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error   error;
    FT_ULong   table_size;
    FT_Byte*   p;
    FT_Byte*   p_limit;
    FT_UInt    nn, num_tables;
    FT_UInt32  avail = 0, ordered = 0;


    /* the kern table is optional; exit silently if it is missing */
    error = face->goto_table( face, TTAG_kern, stream, &table_size );
    if ( error )
      goto Exit;

    if ( table_size < 4 )  /* the case of a malformed table */
    {
      FT_ERROR(( "tt_face_load_kern:"
                 " kerning table is too small - ignored\n" ));
      error = FT_THROW( Table_Missing );
      goto Exit;
    }

    if ( FT_FRAME_EXTRACT( table_size, face->kern_table ) )
    {
      FT_ERROR(( "tt_face_load_kern:"
                 " could not extract kerning table\n" ));
      goto Exit;
    }

    face->kern_table_size = table_size;

    p       = face->kern_table;
    p_limit = p + table_size;

    p         += 2; /* skip version */
    num_tables = FT_NEXT_USHORT( p );

    if ( num_tables > 32 ) /* we only support up to 32 sub-tables */
      num_tables = 32;

    for ( nn = 0; nn < num_tables; nn++ )
    {
      FT_UInt    num_pairs, length, coverage, format;
      FT_Byte*   p_next;
      FT_UInt32  mask = (FT_UInt32)1UL << nn;


      if ( p + 6 > p_limit )
        break;

      p_next = p;

      p       += 2; /* skip version */
      length   = FT_NEXT_USHORT( p );
      coverage = FT_NEXT_USHORT( p );

      if ( length <= 6 + 8 )
        break;

      p_next += length;

      if ( p_next > p_limit )  /* handle broken table */
        p_next = p_limit;

      format = coverage >> 8;

      /* we currently only support format 0 kerning tables */
      if ( format != 0 )
        goto NextTable;

      /* only use horizontal kerning tables */
      if ( ( coverage & 3U ) != 0x0001 ||
           p + 8 > p_next              )
        goto NextTable;

      num_pairs = FT_NEXT_USHORT( p );
      p        += 6;

      if ( ( p_next - p ) < 6 * (int)num_pairs ) /* handle broken count */
        num_pairs = (FT_UInt)( ( p_next - p ) / 6 );

      avail |= mask;

      /*
       * Now check whether the pairs in this table are ordered.
       * We then can use binary search.
       */
      if ( num_pairs > 0 )
      {
        FT_ULong  count;
        FT_ULong  old_pair;


        old_pair = FT_NEXT_ULONG( p );
        p       += 2;

        for ( count = num_pairs - 1; count > 0; count-- )
        {
          FT_UInt32  cur_pair;


          cur_pair = FT_NEXT_ULONG( p );
          if ( cur_pair < old_pair )
            break;

          p += 2;
          old_pair = cur_pair;
        }

        if ( count == 0 )
          ordered |= mask;
      }

    NextTable:
      p = p_next;
    }

    face->num_kern_tables = nn;
    face->kern_avail_bits = avail;
    face->kern_order_bits = ordered;

  Exit:
    return error;
  }